

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O0

void __thiscall CaDiCaL::Proof::add_derived_clause(Proof *this)

{
  bool bVar1;
  reference ppTVar2;
  __normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
  *in_RDI;
  Tracer **tracer;
  iterator __end1;
  iterator __begin1;
  vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_> *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000068;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000070;
  vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
  local_18;
  __normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
  *local_10;
  
  if (in_RDI[0xf]._M_current != (Tracer **)0x0) {
    LratBuilder::add_clause_get_proof
              ((LratBuilder *)__begin1._M_current,(uint64_t)__end1._M_current,
               (vector<int,_std::allocator<int>_> *)tracer);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (in_stack_00000070,in_stack_00000068);
  }
  local_10 = in_RDI + 9;
  local_18._M_current =
       (Tracer **)
       std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>::end(in_stack_ffffffffffffffc8)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
              ::operator*(&local_18);
    (*(*ppTVar2)->_vptr_Tracer[3])
              (*ppTVar2,in_RDI[7]._M_current,(ulong)(*(byte *)&in_RDI[8]._M_current & 1),in_RDI + 1,
               in_RDI + 4);
    __gnu_cxx::
    __normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xe0d5ee);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0xe0d5fc);
  in_RDI[7]._M_current = (Tracer **)0x0;
  return;
}

Assistant:

void Proof::add_derived_clause () {
  LOG (clause, "PROOF adding derived external clause (redundant: %d)",
       redundant);
  assert (clause_id);
  if (lratbuilder) {
    proof_chain = lratbuilder->add_clause_get_proof (clause_id, clause);
  }
  for (auto &tracer : tracers) {
    tracer->add_derived_clause (clause_id, redundant, clause, proof_chain);
  }
  proof_chain.clear ();
  clause.clear ();
  clause_id = 0;
}